

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O3

void __thiscall dgPolyhedra::dgPolyhedra(dgPolyhedra *this,dgPolyhedra *polyhedra)

{
  HaI32 HVar1;
  HaI32 *index;
  HaI64 *userdata;
  dgRedBackNode *pdVar2;
  dgTreeNode *pdVar3;
  dgEdge *pdVar4;
  ulong uVar5;
  dgRedBackNode *pdVar6;
  long lVar7;
  dgEdge *pdVar8;
  Iterator local_40;
  
  pdVar2 = (dgRedBackNode *)0x0;
  (this->super_dgTree<dgEdge,_long>).m_count = 0;
  (this->super_dgTree<dgEdge,_long>).m_head = (dgTreeNode *)0x0;
  this->m_baseMark = 0;
  this->m_edgeMark = 0;
  (this->super_dgTree<dgEdge,_long>)._vptr_dgTree = (_func_int **)&PTR__dgPolyhedra_00b42ac8;
  this->m_faceSecuence = 0;
  index = (HaI32 *)malloc(0x10000);
  userdata = (HaI64 *)malloc(0x20000);
  pdVar3 = (polyhedra->super_dgTree<dgEdge,_long>).m_head;
  local_40.m_tree = &polyhedra->super_dgTree<dgEdge,_long>;
  if (pdVar3 != (dgTreeNode *)0x0) {
    pdVar2 = dgRedBackNode::Minimum(&pdVar3->super_dgRedBackNode);
  }
  local_40.m_ptr = pdVar2;
  if (pdVar2 != (dgRedBackNode *)0x0) {
    do {
      pdVar2 = local_40.m_ptr;
      if (-1 < *(int *)((long)&local_40.m_ptr[1]._vptr_dgRedBackNode + 4)) {
        pdVar3 = (this->super_dgTree<dgEdge,_long>).m_head;
        if (pdVar3 != (dgTreeNode *)0x0) {
          uVar5 = (ulong)*(uint *)&local_40.m_ptr[1]._vptr_dgRedBackNode << 0x20 |
                  (long)**(int **)&local_40.m_ptr[1].field_0x20;
          do {
            lVar7 = 8;
            if ((pdVar3->m_key <= (long)uVar5) && (lVar7 = 0x10, (long)uVar5 <= pdVar3->m_key))
            goto LAB_0085993f;
            pdVar3 = *(dgTreeNode **)
                      ((long)&(pdVar3->super_dgRedBackNode)._vptr_dgRedBackNode + lVar7);
          } while (pdVar3 != (dgTreeNode *)0x0);
        }
        lVar7 = 0;
        pdVar6 = local_40.m_ptr + 1;
        do {
          userdata[lVar7] = (HaI64)pdVar6->m_left;
          index[lVar7] = *(HaI32 *)&pdVar6->_vptr_dgRedBackNode;
          lVar7 = lVar7 + 1;
          pdVar6 = pdVar6->m_right;
        } while (pdVar6 != local_40.m_ptr + 1);
        pdVar4 = AddFace(this,(HaI32)lVar7,index,userdata);
        HVar1 = *(HaI32 *)((long)&pdVar2[1]._vptr_dgRedBackNode + 4);
        pdVar8 = pdVar4;
        do {
          pdVar8->m_incidentFace = HVar1;
          pdVar8 = pdVar8->m_next;
        } while (pdVar8 != pdVar4);
      }
LAB_0085993f:
      dgTree<dgEdge,_long>::Iterator::operator++(&local_40,0);
    } while (local_40.m_ptr != (dgRedBackNode *)0x0);
  }
  EndFace(this);
  this->m_faceSecuence = polyhedra->m_faceSecuence;
  free(userdata);
  free(index);
  return;
}

Assistant:

dgPolyhedra::dgPolyhedra (const dgPolyhedra &polyhedra)
	:dgTree <dgEdge, hacd::HaI64>()
	,m_baseMark(0)
	,m_edgeMark(0)
	,m_faceSecuence(0)
{
	dgStack<hacd::HaI32> indexPool (1024 * 16);
	dgStack<hacd::HaU64> userPool (1024 * 16);
	hacd::HaI32* const index = &indexPool[0];
	hacd::HaU64* const user = &userPool[0];

	BeginFace ();
	Iterator iter(polyhedra);
	for (iter.Begin(); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if (edge->m_incidentFace < 0) {
			continue;
		}

		if (!FindEdge(edge->m_incidentVertex, edge->m_twin->m_incidentVertex))	{
			hacd::HaI32 indexCount = 0;
			dgEdge* ptr = edge;
			do {
				user[indexCount] = ptr->m_userData;
				index[indexCount] = ptr->m_incidentVertex;
				indexCount ++;
				ptr = ptr->m_next;
			} while (ptr != edge);

			dgEdge* const face = AddFace (indexCount, index, (hacd::HaI64*) user);
			ptr = face;
			do {
				ptr->m_incidentFace = edge->m_incidentFace;
				ptr = ptr->m_next;
			} while (ptr != face);
		}
	}
	EndFace();

	m_faceSecuence = polyhedra.m_faceSecuence;

#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck());
#endif
}